

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_primitive_field.cc
# Opt level: O0

void google::protobuf::compiler::objectivec::anon_unknown_5::SetPrimitiveVariables
               (FieldDescriptor *descriptor,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  undefined8 uVar1;
  char *pcVar2;
  mapped_type *pmVar3;
  allocator local_99;
  key_type local_98;
  allocator local_71;
  key_type local_70;
  allocator local_39;
  string local_38 [8];
  string primitive_name;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  FieldDescriptor *descriptor_local;
  
  primitive_name.field_2._8_8_ = variables;
  pcVar2 = PrimitiveTypeName(descriptor);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar2,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  uVar1 = primitive_name.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"type",&local_71);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)uVar1,&local_70);
  std::__cxx11::string::operator=((string *)pmVar3,local_38);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  uVar1 = primitive_name.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"storage_type",&local_99);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)uVar1,&local_98);
  std::__cxx11::string::operator=((string *)pmVar3,local_38);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void SetPrimitiveVariables(const FieldDescriptor* descriptor,
                           map<string, string>* variables) {
  std::string primitive_name = PrimitiveTypeName(descriptor);
  (*variables)["type"] = primitive_name;
  (*variables)["storage_type"] = primitive_name;
}